

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O0

void __thiscall OpenMD::StatWriter::writeArray(StatWriter *this,int i)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 uVar4;
  ostream *in_RDI;
  uint j;
  vector<double,_std::allocator<double>_> s;
  ostream *in_stack_ffffffffffffff70;
  Stats *in_stack_ffffffffffffff78;
  errorStruct *in_stack_ffffffffffffff80;
  undefined1 local_60 [20];
  int in_stack_ffffffffffffffb4;
  pointer in_stack_ffffffffffffffb8;
  uint local_2c;
  
  Stats::getArrayData((Stats *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  local_2c = 0;
  do {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd8);
    if (sVar2 <= local_2c) {
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80);
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd8,
                        (ulong)local_2c);
    uVar1 = std::isinf(*pvVar3);
    if ((uVar1 & 1) == 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd8,
                          (ulong)local_2c);
      uVar1 = std::isnan(*pvVar3);
      if ((uVar1 & 1) != 0) goto LAB_0019e39c;
      in_stack_ffffffffffffff70 = std::operator<<(in_RDI,"\t");
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd8,
                          (ulong)local_2c);
      std::ostream::operator<<(in_stack_ffffffffffffff70,*pvVar3);
    }
    else {
LAB_0019e39c:
      Stats::getTitle_abi_cxx11_
                (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      in_stack_ffffffffffffff78 = (Stats *)local_60;
      uVar4 = std::__cxx11::string::c_str();
      in_stack_ffffffffffffff80 = &painCave;
      snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",uVar4);
      std::__cxx11::string::~string((string *)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff80->isFatal = 1;
      simError();
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void StatWriter::writeArray(int i) {
    std::vector<RealType> s = stats_->getArrayData(i);

    for (unsigned int j = 0; j < s.size(); ++j) {
      if (std::isinf(s[j]) || std::isnan(s[j])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StatWriter detected a numerical error writing: %s",
                 stats_->getTitle(i).c_str());
        painCave.isFatal = 1;
        simError();
      } else {
        statfile_ << "\t" << s[j];
      }
    }
  }